

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O0

Float<unsigned_int,_8,_23,_127,_3U>
tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
          (Float<unsigned_short,_5,_10,_15,_3U> *other)

{
  byte bVar1;
  bool bVar2;
  StorageType_conflict SVar3;
  StorageType extraout_EAX;
  int iVar4;
  size_t *in_RCX;
  uchar *sig;
  uchar *sig_00;
  uchar *sig_01;
  EVP_PKEY_CTX *in_RSI;
  Float<unsigned_short,_5,_10,_15,_3U> *__tagb;
  uchar *in_R8;
  size_t in_R9;
  int bitDiff_1;
  deUint64 bias;
  deUint64 half;
  ulong uStack_30;
  int bitDiff;
  deUint64 m;
  int e;
  StorageType s;
  int eMax;
  int eMin;
  Float<unsigned_short,_5,_10,_15,_3U> *other_local;
  
  bVar2 = Float<unsigned_short,_5,_10,_15,_3U>::isInf(other);
  if (bVar2) {
    iVar4 = Float<unsigned_short,_5,_10,_15,_3U>::sign(other,in_RSI,sig,in_RCX,in_R8,in_R9);
    other_local._4_4_ = Float<unsigned_int,_8,_23,_127,_3U>::inf(iVar4);
  }
  else {
    __tagb = other;
    bVar2 = Float<unsigned_short,_5,_10,_15,_3U>::isNaN(other);
    if (bVar2) {
      Float<unsigned_int,_8,_23,_127,_3U>::nan((char *)__tagb);
      other_local._4_4_ = extraout_EAX;
    }
    else {
      bVar2 = Float<unsigned_short,_5,_10,_15,_3U>::isZero(other);
      if (bVar2) {
        iVar4 = Float<unsigned_short,_5,_10,_15,_3U>::sign(other,in_RSI,sig_00,in_RCX,in_R8,in_R9);
        other_local._4_4_ = Float<unsigned_int,_8,_23,_127,_3U>::zero(iVar4);
      }
      else {
        iVar4 = Float<unsigned_short,_5,_10,_15,_3U>::signBit(other);
        m._0_4_ = Float<unsigned_short,_5,_10,_15,_3U>::exponent(other);
        SVar3 = Float<unsigned_short,_5,_10,_15,_3U>::mantissa(other);
        for (uStack_30 = (ulong)SVar3; (uStack_30 & 0x400) == 0; uStack_30 = uStack_30 << 1) {
          m._0_4_ = (int)m + -1;
        }
        if ((int)m < -0x7e) {
          if (-0x7f - (int)m < 0x18) {
            bVar1 = -(char)(int)m + 0x75;
            Float<unsigned_int,_8,_23,_127,_3U>::Float
                      ((Float<unsigned_int,_8,_23,_127,_3U> *)((long)&other_local + 4),
                       iVar4 << 0x1f |
                       (uint)(uStack_30 + (1L << (-(char)(int)m + 0x74U & 0x3f)) + -1 +
                              (uStack_30 >> (bVar1 & 0x3f) & 1) >> (bVar1 & 0x3f)));
          }
          else {
            iVar4 = Float<unsigned_short,_5,_10,_15,_3U>::sign
                              (other,in_RSI,sig_01,in_RCX,in_R8,in_R9);
            other_local._4_4_ = Float<unsigned_int,_8,_23,_127,_3U>::zero(iVar4);
          }
        }
        else if ((int)m < 0x80) {
          Float<unsigned_int,_8,_23,_127,_3U>::Float
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)((long)&other_local + 4),
                     iVar4 << 0x1f | ((int)m + 0x7f) * 0x800000 |
                     (uint)((uStack_30 & 0xfffffffffffffbff) << 0xd));
        }
        else {
          iVar4 = Float<unsigned_short,_5,_10,_15,_3U>::sign
                            (other,in_RSI,sig_01,(size_t *)0xd,in_R8,in_R9);
          other_local._4_4_ = Float<unsigned_int,_8,_23,_127,_3U>::inf(iVar4);
        }
      }
    }
  }
  return (Float<unsigned_int,_8,_23,_127,_3U>)other_local._4_4_;
}

Assistant:

Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>
Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>::convert
	(const Float<OtherStorageType, OtherExponentBits, OtherMantissaBits, OtherExponentBias, OtherFlags>& other)
{
	if (!(Flags & FLOAT_HAS_SIGN) && other.sign() < 0)
	{
		// Negative number, truncate to zero.
		return zero(+1);
	}
	else if (other.isInf())
	{
		return inf(other.sign());
	}
	else if (other.isNaN())
	{
		return nan();
	}
	else if (other.isZero())
	{
		return zero(other.sign());
	}
	else
	{
		const int			eMin	= 1 - ExponentBias;
		const int			eMax	= ((1<<ExponentBits)-2) - ExponentBias;

		const StorageType	s		= StorageType((StorageType(other.signBit())) << (StorageType(ExponentBits+MantissaBits))); // \note Not sign, but sign bit.
		int					e		= other.exponent();
		deUint64			m		= other.mantissa();

		// Normalize denormalized values prior to conversion.
		while (!(m & (1ull<<OtherMantissaBits)))
		{
			m <<= 1;
			e  -= 1;
		}

		if (e < eMin)
		{
			// Underflow.
			if ((Flags & FLOAT_SUPPORT_DENORM) && (eMin-e-1 <= MantissaBits))
			{
				// Shift and round (RTE).
				int			bitDiff	= (OtherMantissaBits-MantissaBits) + (eMin-e);
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				return Float(StorageType(s | (m + half + bias) >> bitDiff));
			}
			else
				return zero(other.sign());
		}
		else
		{
			// Remove leading 1.
			m = m & ~(1ull<<OtherMantissaBits);

			if (MantissaBits < OtherMantissaBits)
			{
				// Round mantissa (round to nearest even).
				int			bitDiff	= OtherMantissaBits-MantissaBits;
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				m = (m + half + bias) >> bitDiff;

				if (m & (1ull<<MantissaBits))
				{
					// Overflow in mantissa.
					m  = 0;
					e += 1;
				}
			}
			else
			{
				int bitDiff = MantissaBits-OtherMantissaBits;
				m = m << bitDiff;
			}

			if (e > eMax)
			{
				// Overflow.
				return inf(other.sign());
			}
			else
			{
				DE_ASSERT(de::inRange(e, eMin, eMax));
				DE_ASSERT(((e + ExponentBias) & ~((1ull<<ExponentBits)-1)) == 0);
				DE_ASSERT((m & ~((1ull<<MantissaBits)-1)) == 0);

				return Float(StorageType(s | (StorageType(e + ExponentBias) << MantissaBits) | m));
			}
		}
	}
}